

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::Test<int,2,false,1u,false>
          (StorageAndSubImageTest *this)

{
  bool bVar1;
  GLenum internal_format;
  bool result;
  StorageAndSubImageTest *this_local;
  
  internal_format = Reference::InternalFormat<int,2,false>();
  PrepareFramebuffer(this,internal_format,1);
  bVar1 = CreateTexture<int,2,false,1u,false>(this);
  if (bVar1) {
    Draw(this);
    this_local._7_1_ = Check<int,2,false,1u>(this);
    CleanTexture(this);
    CleanFramebuffer(this);
    CleanErrors(this);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StorageAndSubImageTest::Test()
{
	/* Setup. */
	PrepareFramebuffer(InternalFormat<T, S, N>(), D);

	if (!CreateTexture<T, S, N, D, I>())
	{
		return false;
	}

	/* Action. */
	Draw();

	/* Compare results with reference. */
	bool result = Check<T, S, N, D>();

	/* Cleanup. */
	CleanTexture();
	CleanFramebuffer();
	CleanErrors();

	/* Pass result. */
	return result;
}